

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O2

int __thiscall CVmObjVector::equals(CVmObjVector *this,vm_obj_id_t self,vm_val_t *val,int depth)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  size_t idx;
  vm_val_t val2;
  vm_val_t val1;
  
  if (0x100 < depth) {
    err_throw(0x7ee);
  }
  if ((val->typ != VM_OBJ) || (iVar3 = 1, (val->val).obj != self)) {
    iVar1 = vm_val_t::is_listlike(val);
    iVar3 = 0;
    if ((iVar1 != 0) &&
       ((uVar2 = vm_val_t::ll_length(val), iVar3 = 0, -1 < (int)uVar2 &&
        (uVar2 == *(ushort *)((this->super_CVmObjCollection).super_CVmObject.ext_ + 2))))) {
      idx = 0;
      do {
        if (uVar2 == idx) {
          return 1;
        }
        get_element(this,idx,&val1);
        idx = idx + 1;
        vm_val_t::ll_index(val,&val2,(int)idx);
        iVar3 = vm_val_t::equals(&val1,&val2,depth + 1);
      } while (iVar3 != 0);
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int CVmObjVector::equals(VMG_ vm_obj_id_t self, const vm_val_t *val,
                         int depth) const
{
    int cnt;
    int cnt2;
    int idx;

    /* if the recursion depth is excessive, throw an error */
    if (depth > VM_MAX_TREE_DEPTH_EQ)
        err_throw(VMERR_TREE_TOO_DEEP_EQ);

    /* if the other value is a reference to myself, we certainly match */
    if (val->typ == VM_OBJ && val->val.obj == self)
    {
        /* no need to look at the contents if this is a reference to me */
        return TRUE;
    }

    /* if it's not list-like, it's not a match */
    if (!val->is_listlike(vmg0_) || (cnt2 = val->ll_length(vmg0_)) < 0)
        return FALSE;

    /* if the sizes don't match, the values are not equal */
    cnt = get_element_count();
    if (cnt != cnt2)
        return FALSE;

    /* compare element by element */
    for (idx = 0 ; idx < cnt ; ++idx)
    {
        vm_val_t val1;
        vm_val_t val2;
        
        /* get this element of self */
        get_element(idx, &val1);

        /* get this element of the other value */
        val->ll_index(vmg_ &val2, idx + 1);
        
        /* if these elements aren't equal, our values aren't equal */
        if (!val1.equals(vmg_ &val2, depth + 1))
            return FALSE;
    }

    /* we didn't find any differences, so the values are equal */
    return TRUE;
}